

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountLatchZeroCountZeroDuration_Test::TestBody
          (CountdownLatchTest_TestCountLatchZeroCountZeroDuration_Test *this)

{
  char *in_R9;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_a0;
  AssertionResult gtest_ar_;
  CountdownLatch latch;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(&latch,0);
  gtest_ar_.success_ = (bool)bidfx_public_api::tools::CountdownLatch::Await(&latch,0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&gtest_ar_,
               (AssertionResult *)"latch.Await(std::chrono::milliseconds(0))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x68,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::condition_variable::~condition_variable((condition_variable *)&latch);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountLatchZeroCountZeroDuration)
{
    CountdownLatch latch = CountdownLatch(0);
    EXPECT_TRUE(latch.Await(std::chrono::milliseconds(0)));
}